

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O0

void __thiscall
CVmObjStrCompMapReaderList::read_mapping
          (CVmObjStrCompMapReaderList *this,wchar_t *ref_ch,unsigned_long *uc_result_flags,
          unsigned_long *lc_result_flags,wchar_t *val_buf,size_t *value_ch_cnt)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  vm_val_t *this_00;
  size_t sVar4;
  utf8_ptr *this_01;
  long *in_RCX;
  long *in_RDX;
  wchar_t *in_RSI;
  long in_RDI;
  wchar_t *in_R8;
  long *in_R9;
  utf8_ptr p;
  size_t rem;
  size_t copy_rem;
  char *valstr;
  char *refstr;
  vm_val_t sublst;
  vm_val_t val;
  vm_val_t *in_stack_ffffffffffffff78;
  utf8_ptr in_stack_ffffffffffffff88;
  vm_val_t *in_stack_ffffffffffffff90;
  int idx;
  vm_val_t *ret;
  vm_val_t *in_stack_ffffffffffffffa0;
  int local_40;
  int local_38;
  wchar_t *local_28;
  
  utf8_ptr::utf8_ptr((utf8_ptr *)&stack0xffffffffffffff88);
  ret = (vm_val_t *)*in_R9;
  vm_val_t::ll_index(in_stack_ffffffffffffffa0,ret,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  iVar1 = vm_val_t::is_listlike(in_stack_ffffffffffffff90);
  idx = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  if ((iVar1 == 0) ||
     (iVar1 = vm_val_t::ll_length((vm_val_t *)in_stack_ffffffffffffff88.p_), iVar1 < 0)) {
    err_throw(0);
  }
  vm_val_t::ll_index(in_stack_ffffffffffffffa0,ret,idx);
  pcVar3 = vm_val_t::get_as_string(in_stack_ffffffffffffff78);
  vm_val_t::ll_index(in_stack_ffffffffffffffa0,ret,idx);
  this_00 = (vm_val_t *)vm_val_t::get_as_string(in_stack_ffffffffffffff78);
  if ((pcVar3 == (char *)0x0) || (this_00 == (vm_val_t *)0x0)) {
    err_throw(0);
  }
  sVar4 = vmb_get_len((char *)0x38e147);
  if ((sVar4 == 0) || (sVar4 = vmb_get_len((char *)0x38e157), sVar4 == 0)) {
    err_throw(0);
  }
  wVar2 = utf8_ptr::s_getch(pcVar3 + 2);
  *in_RSI = wVar2;
  utf8_ptr::set((utf8_ptr *)&stack0xffffffffffffff88,(char *)((long)&this_00->typ + 2));
  this_01 = (utf8_ptr *)vmb_get_len((char *)0x38e19b);
  *in_R9 = 0;
  local_28 = in_R8;
  while (this_01 != (utf8_ptr *)0x0) {
    if (ret != (vm_val_t *)0x0) {
      wVar2 = utf8_ptr::getch((utf8_ptr *)0x38e1c6);
      *local_28 = wVar2;
      ret = (vm_val_t *)((long)&ret[-1].val + 7);
      local_28 = local_28 + 1;
    }
    *in_R9 = *in_R9 + 1;
    utf8_ptr::inc(this_01,(size_t *)in_stack_ffffffffffffff88.p_);
  }
  vm_val_t::ll_index(this_00,ret,0);
  if (local_40 == 7) {
    *in_RDX = (long)local_38;
    vm_val_t::ll_index(this_00,ret,(int)((ulong)this_01 >> 0x20));
    *in_RCX = (long)local_38;
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    return;
  }
  err_throw(0);
}

Assistant:

virtual void read_mapping(VMG_ wchar_t *ref_ch,
                              unsigned long *uc_result_flags,
                              unsigned long *lc_result_flags,
                              wchar_t *val_buf, size_t *value_ch_cnt)
    {
        vm_val_t val;
        vm_val_t sublst;
        const char *refstr;
        const char *valstr;
        size_t copy_rem;
        size_t rem;
        utf8_ptr p;

        /* note the size limit of the caller's value string buffer */
        copy_rem = *value_ch_cnt;

        /* retrieve the next element of the list */
        lst_->ll_index(vmg_ &sublst, idx_);

        /* get the value as a sublist */
        if (!sublst.is_listlike(vmg0_) || sublst.ll_length(vmg0_) < 0)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* retrieve the reference character string (sublst's 1st element) */
        sublst.ll_index(vmg_ &val, 1);
        refstr = val.get_as_string(vmg0_);

        /* retrieve the value string (sublst's 2nd element) */
        sublst.ll_index(vmg_ &val, 2);
        valstr = val.get_as_string(vmg0_);

        /* make sure the reference and value strings are indeed strings */
        if (refstr == 0 || valstr == 0)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* we need at least one character in each string */
        if (vmb_get_len(refstr) == 0 || vmb_get_len(valstr) == 0)
            err_throw(VMERR_BAD_VAL_BIF);

        /* fill in the caller's reference character from the ref string */
        *ref_ch = utf8_ptr::s_getch(refstr + VMB_LEN);

        /* store the characters of the value string, up to the buffer limit */
        p.set((char *)valstr + VMB_LEN);
        rem = vmb_get_len(valstr);
        for (*value_ch_cnt = 0 ; rem != 0 ; p.inc(&rem))
        {
            /* if we have room, copy this character */
            if (copy_rem != 0)
            {
                /* copy the character */
                *val_buf++ = p.getch();

                /* count it */
                --copy_rem;
            }

            /* count it in the actual length */
            ++(*value_ch_cnt);
        }

        /* get the upper-case flags (sublst's 3rd element) */
        sublst.ll_index(vmg_ &val, 3);
        if (val.typ != VM_INT)
            err_throw(VMERR_BAD_TYPE_BIF);
        *uc_result_flags = val.val.intval;

        /* get the lower-case flags (sublst's 4th element) */
        sublst.ll_index(vmg_ &val, 4);
        if (val.typ != VM_INT)
            err_throw(VMERR_BAD_TYPE_BIF);
        *lc_result_flags = val.val.intval;

        /* we're done with this mapping, so advance to the next one */
        ++idx_;
    }